

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O3

QString * __thiscall
DebugDirCVEntryWrapper::getSignature(QString *__return_storage_ptr__,DebugDirCVEntryWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *pcStack_20;
  qsizetype local_18;
  
  iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])(this);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    QVar2.m_data = (storage_type *)0x0;
    QVar2.m_size = (qsizetype)&local_28;
    QString::fromUtf8(QVar2);
    (__return_storage_ptr__->d).d = local_28;
    (__return_storage_ptr__->d).ptr = pcStack_20;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QString::asprintf((char *)&local_28,"%.4s",CONCAT44(extraout_var,iVar1));
    (__return_storage_ptr__->d).d = local_28;
    (__return_storage_ptr__->d).ptr = pcStack_20;
  }
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

QString DebugDirCVEntryWrapper::getSignature()
{
    DEBUG_RSDSI* rdsi = (DEBUG_RSDSI*)this->getPtr();
    if (!rdsi) return "";

    QString out;
#if QT_VERSION >= 0x050000
    out = QString().asprintf("%.4s", (char*)&rdsi->dwSig);
#else
    out = QString().sprintf("%.4s", (char*)&rdsi->dwSig);
#endif
    return out;
}